

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yescrypt-platform.c
# Opt level: O0

int yescrypt_init_shared
              (yescrypt_shared_t *shared,uint8_t *param,size_t paramlen,uint64_t N,uint32_t r,
              uint32_t p,yescrypt_init_shared_flags_t flags,uint8_t *buf,size_t buflen)

{
  int iVar1;
  ulong passwdlen;
  yescrypt_local_t *pyVar2;
  yescrypt_local_t *in_RCX;
  yescrypt_shared_t *in_RDX;
  long in_RSI;
  yescrypt_region_t *in_RDI;
  int in_R8D;
  uint in_R9D;
  uint64_t unaff_retaddr;
  uint in_stack_00000008;
  uint32_t in_stack_00000010;
  undefined4 in_stack_00000014;
  uint32_t in_stack_00000018;
  undefined4 in_stack_0000001c;
  uint32_t in_stack_00000020;
  yescrypt_flags_t in_stack_00000028;
  uint8_t *in_stack_00000030;
  size_t in_stack_00000038;
  uint8_t salt [32];
  yescrypt_shared_t half2;
  yescrypt_shared_t half1;
  size_t in_stack_ffffffffffffffa0;
  void *saltlen;
  uint8_t *in_stack_ffffffffffffffa8;
  uint8_t *salt_00;
  size_t in_stack_ffffffffffffffb0;
  yescrypt_local_t *pyVar3;
  int local_1c;
  
  if ((in_stack_00000008 & 0x100) == 0) {
    init_region(in_RDI);
  }
  else if ((in_RDI->aligned == (void *)0x0) || (in_RDI->aligned_size == 0)) {
    return -1;
  }
  if (((((in_RSI == 0) && (in_RDX == (yescrypt_shared_t *)0x0)) &&
       (in_RCX == (yescrypt_local_t *)0x0)) && ((in_R8D == 0 && (in_R9D == 0)))) &&
     ((CONCAT44(in_stack_00000014,in_stack_00000010) == 0 &&
      (CONCAT44(in_stack_0000001c,in_stack_00000018) == 0)))) {
    local_1c = 0;
  }
  else {
    pyVar2 = in_RCX;
    iVar1 = yescrypt_kdf(in_RDX,in_RCX,(uint8_t *)CONCAT44(in_R8D,in_R9D),in_stack_ffffffffffffffb0,
                         in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,unaff_retaddr,
                         in_stack_00000008,in_stack_00000010,in_stack_00000018,in_stack_00000020,
                         in_stack_00000028,in_stack_00000030,in_stack_00000038);
    if (iVar1 == 0) {
      saltlen = in_RDI->aligned;
      salt_00 = (uint8_t *)in_RDI->base_size;
      passwdlen = in_RDI->aligned_size >> 1;
      pyVar2 = (yescrypt_local_t *)((ulong)pyVar2 >> 1);
      if (((in_R9D < 2) ||
          (pyVar3 = pyVar2,
          iVar1 = yescrypt_kdf(in_RDX,pyVar2,(uint8_t *)CONCAT44(in_R8D,in_R9D),passwdlen,salt_00,
                               (size_t)saltlen,unaff_retaddr,in_stack_00000008,in_stack_00000010,
                               in_stack_00000018,in_stack_00000020,in_stack_00000028,
                               in_stack_00000030,in_stack_00000038), in_RCX = pyVar2,
          pyVar2 = pyVar3, iVar1 == 0)) &&
         ((in_RCX = pyVar2, pyVar2 = in_RCX,
          iVar1 = yescrypt_kdf(in_RDX,in_RCX,(uint8_t *)CONCAT44(in_R8D,in_R9D),passwdlen,salt_00,
                               (size_t)saltlen,unaff_retaddr,in_stack_00000008,in_stack_00000010,
                               in_stack_00000018,in_stack_00000020,in_stack_00000028,
                               in_stack_00000030,in_stack_00000038), iVar1 == 0 &&
          (iVar1 = yescrypt_kdf(in_RDX,pyVar2,(uint8_t *)CONCAT44(in_R8D,in_R9D),passwdlen,salt_00,
                                (size_t)saltlen,unaff_retaddr,in_stack_00000008,in_stack_00000010,
                                in_stack_00000018,in_stack_00000020,in_stack_00000028,
                                in_stack_00000030,in_stack_00000038), in_RCX = pyVar2, iVar1 == 0)))
         ) {
        return 0;
      }
    }
    if ((in_stack_00000008 & 0x100) == 0) {
      free_region(in_RCX);
    }
    local_1c = -1;
  }
  return local_1c;
}

Assistant:

int
yescrypt_init_shared(yescrypt_shared_t * shared,
    const uint8_t * param, size_t paramlen,
    uint64_t N, uint32_t r, uint32_t p,
    yescrypt_init_shared_flags_t flags,
    uint8_t * buf, size_t buflen)
{
	yescrypt_shared_t half1, half2;
	uint8_t salt[32];

	if (flags & YESCRYPT_SHARED_PREALLOCATED) {
		if (!shared->aligned || !shared->aligned_size)
			return -1;
	} else {
		init_region(shared);
	}
	if (!param && !paramlen && !N && !r && !p && !buf && !buflen)
		return 0;

	if (yescrypt_kdf(NULL, shared,
	    param, paramlen, NULL, 0, N, r, p, 0, 0,
	    YESCRYPT_RW | __YESCRYPT_INIT_SHARED_1,
	    salt, sizeof(salt)))
		goto out;

	half1 = half2 = *shared;
	half1.aligned_size /= 2;
	half2.aligned += half1.aligned_size;
	half2.aligned_size = half1.aligned_size;
	N /= 2;

	if (p > 1 && yescrypt_kdf(&half1, &half2,
	    param, paramlen, salt, sizeof(salt), N, r, p, 0, 0,
	    YESCRYPT_RW | __YESCRYPT_INIT_SHARED_2,
	    salt, sizeof(salt)))
		goto out;

	if (yescrypt_kdf(&half2, &half1,
	    param, paramlen, salt, sizeof(salt), N, r, p, 0, 0,
	    YESCRYPT_RW | __YESCRYPT_INIT_SHARED_1,
	    salt, sizeof(salt)))
		goto out;

	if (yescrypt_kdf(&half1, &half2,
	    param, paramlen, salt, sizeof(salt), N, r, p, 0, 0,
	    YESCRYPT_RW | __YESCRYPT_INIT_SHARED_1,
	    buf, buflen))
		goto out;

	return 0;

out:
	if (!(flags & YESCRYPT_SHARED_PREALLOCATED))
		free_region(shared);
	return -1;
}